

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

void __thiscall
mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnObj
          (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *this,int index,
          Type type,NumericExpr expr)

{
  MutObjective MVar1;
  MutObjective local_28;
  
  MVar1 = BasicProblem<mp::BasicProblemParams<int>_>::obj(this->builder_,index);
  local_28.
  super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_ =
       MVar1.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  local_28.
  super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_ =
       MVar1.
       super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>::
  SetObj<mp::BasicProblem<mp::BasicProblemParams<int>>::MutObjective>
            ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>> *)this,&local_28,type,
             expr);
  (*this->_vptr_NLProblemBuilder[4])(this);
  return;
}

Assistant:

void OnObj(int index, obj::Type type, NumericExpr expr) {
    SetObj(builder_.obj(index), type, expr);
    notify_obj_added();
  }